

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.H
# Opt level: O0

void __thiscall
amrex::EB2::
GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>_>
::GShopLevel(GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>_>
             *this,IndexSpace *is,int param_3,int max_grid_size,int param_5,Geometry *geom,
            GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>_>
            *fineLevel)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  long in_RDI;
  Level *in_stack_00000008;
  int ierr_1;
  Level fine_level_2;
  int ierr;
  bool coarsenable;
  int min_width;
  int coarse_ratio;
  BoxArray *fine_covered_grids;
  BoxArray *fine_grids;
  IntVect v;
  undefined4 in_stack_ffffffffffffe290;
  undefined8 in_stack_ffffffffffffe2a8;
  undefined3 uVar5;
  undefined4 in_stack_ffffffffffffe2b0;
  undefined4 in_stack_ffffffffffffe2b4;
  undefined4 in_stack_ffffffffffffe2b8;
  undefined4 in_stack_ffffffffffffe2bc;
  undefined4 in_stack_ffffffffffffe2c0;
  undefined4 in_stack_ffffffffffffe2c4;
  int local_1d34;
  int local_1d30;
  int local_1d2c;
  bool local_1d1b;
  bool local_1d1a;
  int in_stack_ffffffffffffed44;
  Level *in_stack_ffffffffffffed48;
  Level *in_stack_ffffffffffffed50;
  IntVect in_stack_ffffffffffffed68;
  int local_1c4;
  int iStack_1c0;
  int local_1bc;
  long local_1b8;
  int local_1b0;
  long local_1a8;
  int local_1a0;
  bool local_189;
  undefined4 local_188;
  undefined4 local_184;
  BoxArray *local_180;
  BoxArray *local_178;
  long local_148;
  int local_140;
  undefined4 local_134;
  IntVect *local_130;
  undefined8 local_128;
  int local_120;
  int local_118 [2];
  int local_110;
  undefined4 local_104;
  int *local_100;
  IntVect local_f8;
  undefined4 local_ec;
  int *local_e8;
  undefined4 local_dc;
  int *local_d8;
  undefined4 local_cc;
  int *local_c8;
  int local_c0 [2];
  int local_b8;
  undefined4 local_ac;
  int *local_a8;
  IntVect local_a0;
  undefined4 local_94;
  int *local_90;
  undefined4 local_84;
  int *local_80;
  undefined4 local_74;
  int *local_70;
  IntVect *local_68;
  int *local_60;
  undefined4 local_54;
  IntVect *local_50;
  undefined4 local_44;
  IntVect *local_40;
  undefined4 local_34;
  IntVect *local_30;
  int local_28 [2];
  int local_20;
  IntVect local_18;
  undefined4 local_c;
  undefined8 *local_8;
  undefined4 uVar6;
  
  Level::Level((Level *)CONCAT44(in_stack_ffffffffffffe2c4,in_stack_ffffffffffffe2c0),
               (IndexSpace *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
               (Geometry *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0));
  bVar3 = Level::isAllRegular(in_stack_00000008);
  if (bVar3) {
    *(undefined1 *)(in_RDI + 0x1ac8) = 1;
    *(undefined1 *)(in_RDI + 0x1ac9) = 1;
  }
  else {
    local_178 = &in_stack_00000008->m_grids;
    local_180 = &in_stack_00000008->m_covered_grids;
    local_184 = 2;
    local_188 = 8;
    bVar3 = BoxArray::coarsenable
                      ((BoxArray *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
                       (int)((ulong)in_stack_ffffffffffffe2a8 >> 0x20),
                       (int)in_stack_ffffffffffffe2a8);
    local_1d1a = false;
    if (bVar3) {
      bVar3 = BoxArray::empty((BoxArray *)0x788517);
      local_1d1b = true;
      if (!bVar3) {
        local_1d1b = BoxArray::coarsenable
                               ((BoxArray *)
                                CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
                                (int)((ulong)in_stack_ffffffffffffe2a8 >> 0x20),
                                (int)in_stack_ffffffffffffe2a8);
      }
      local_1d1a = local_1d1b;
    }
    local_130 = &in_stack_00000008->m_ngrow;
    local_1d34 = (in_stack_00000008->m_ngrow).vect[2];
    lVar1 = *(long *)local_130->vect;
    local_8 = &local_128;
    local_128._0_4_ = (int)lVar1;
    if ((int)local_128 < 0) {
      local_128._0_4_ = (int)local_128 + 1;
      if ((int)local_128 < 1) {
        local_128._0_4_ = -(int)local_128;
      }
      local_1d2c = -(int)local_128 / 2 + -1;
    }
    else {
      local_1d2c = (int)local_128 / 2;
    }
    local_128._4_4_ = (int)((ulong)lVar1 >> 0x20);
    local_1d30 = local_128._4_4_;
    local_128 = lVar1;
    local_128._0_4_ = local_1d2c;
    if (lVar1 < 0) {
      local_1d30 = local_1d30 + 1;
      if (local_1d30 < 1) {
        local_1d30 = -local_1d30;
      }
      local_1d30 = -local_1d30 / 2 + -1;
    }
    else {
      local_1d30 = local_1d30 / 2;
    }
    local_128._4_4_ = local_1d30;
    if (local_1d34 < 0) {
      local_1d34 = local_1d34 + 1;
      if (local_1d34 < 1) {
        local_1d34 = -local_1d34;
      }
      local_1d34 = -local_1d34 / 2 + -1;
    }
    else {
      local_1d34 = local_1d34 / 2;
    }
    local_c = 2;
    local_120 = local_1d34;
    local_134 = 2;
    local_189 = local_1d1a;
    local_140 = local_1d34;
    local_148 = local_128;
    local_1b0 = local_1d34;
    local_1b8 = local_128;
    local_1a0 = local_1d34;
    local_1a8 = local_128;
    local_a8 = (int *)(in_RDI + 200);
    *(int *)(in_RDI + 0xd0) = local_1d34;
    *(long *)(in_RDI + 200) = local_128;
    local_ac = 2;
    local_74 = 0;
    local_84 = 1;
    local_94 = 2;
    local_90 = local_a8;
    local_80 = local_a8;
    local_70 = local_a8;
    IntVect::IntVect(&local_a0,*local_a8 * 2,*(int *)(in_RDI + 0xcc) * 2,*(int *)(in_RDI + 0xd0) * 2
                    );
    local_b8 = local_a0.vect[2];
    local_c0[0] = local_a0.vect[0];
    local_c0[1] = local_a0.vect[1];
    local_1c4 = local_a0.vect[0];
    iStack_1c0 = local_a0.vect[1];
    uVar2 = _local_1c4;
    local_1bc = local_a0.vect[2];
    local_68 = &in_stack_00000008->m_ngrow;
    local_60 = &local_1c4;
    local_1c4 = local_a0.vect[0];
    local_34 = 0;
    uVar5 = (undefined3)in_stack_ffffffffffffe2b0;
    uVar6 = CONCAT13(1,uVar5);
    if (local_1c4 == local_68->vect[0]) {
      iStack_1c0 = local_a0.vect[1];
      local_44 = 1;
      uVar6 = CONCAT13(1,uVar5);
      local_40 = local_68;
      if (iStack_1c0 == (in_stack_00000008->m_ngrow).vect[1]) {
        local_54 = 2;
        uVar6 = CONCAT13(local_a0.vect[2] != (in_stack_00000008->m_ngrow).vect[2],uVar5);
        local_50 = local_68;
      }
    }
    _local_1c4 = uVar2;
    local_30 = local_68;
    if ((char)((uint)uVar6 >> 0x18) != '\0') {
      IntVect::IntVect(&local_18,0);
      local_20 = local_18.vect[2];
      local_28[0] = local_18.vect[0];
      local_28[1] = local_18.vect[1];
      *(undefined8 *)(in_RDI + 200) = local_18.vect._0_8_;
      *(int *)(in_RDI + 0xd0) = local_18.vect[2];
    }
    if ((local_189 & 1U) == 0) {
      Level::Level((Level *)CONCAT44(in_stack_ffffffffffffe2c4,in_stack_ffffffffffffe2c0),
                   (IndexSpace *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
                   (Geometry *)CONCAT44(in_stack_ffffffffffffe2b4,uVar6));
      local_100 = (int *)(in_RDI + 200);
      local_104 = 2;
      local_cc = 0;
      local_dc = 1;
      local_ec = 2;
      local_e8 = local_100;
      local_d8 = local_100;
      local_c8 = local_100;
      IntVect::IntVect(&local_f8,*local_100 * 2,*(int *)(in_RDI + 0xcc) * 2,
                       *(int *)(in_RDI + 0xd0) * 2);
      local_110 = local_f8.vect[2];
      local_118[0] = local_f8.vect[0];
      local_118[1] = local_f8.vect[1];
      Level::prepareForCoarsening
                (in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,in_stack_ffffffffffffed44,
                 in_stack_ffffffffffffed68);
      iVar4 = Level::coarsenFromFine
                        ((Level *)fine_level_2.m_mgf.super_LayoutData<amrex::EB2::GFab>.
                                  super_FabArrayBase._vptr_FabArrayBase,
                         (Level *)fine_level_2.m_dmap.m_ref.
                                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi,
                         fine_level_2.m_dmap.m_ref.
                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._7_1_);
      *(bool *)(in_RDI + 0x1ac9) = iVar4 == 0;
      Level::~Level((Level *)CONCAT44(iVar4,in_stack_ffffffffffffe290));
    }
    else {
      iVar4 = Level::coarsenFromFine
                        ((Level *)fine_level_2.m_mgf.super_LayoutData<amrex::EB2::GFab>.
                                  super_FabArrayBase._vptr_FabArrayBase,
                         (Level *)fine_level_2.m_dmap.m_ref.
                                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi,
                         fine_level_2.m_dmap.m_ref.
                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._7_1_);
      *(bool *)(in_RDI + 0x1ac9) = iVar4 == 0;
    }
  }
  return;
}

Assistant:

GShopLevel<G>::GShopLevel (IndexSpace const* is, int /*ilev*/, int max_grid_size, int /*ngrow*/,
                           const Geometry& geom, GShopLevel<G>& fineLevel)
    : Level(is, geom)
{
    if (fineLevel.isAllRegular()) {
        m_allregular = true;
        m_ok = true;
        return;
    }

    BL_PROFILE("EB2::GShopLevel()-coarse");

    const BoxArray& fine_grids = fineLevel.m_grids;
    const BoxArray& fine_covered_grids = fineLevel.m_covered_grids;

    const int coarse_ratio = 2;
    const int min_width = 8;
    bool coarsenable = fine_grids.coarsenable(coarse_ratio, min_width)
        && (fine_covered_grids.empty() || fine_covered_grids.coarsenable(coarse_ratio));

    m_ngrow = amrex::coarsen(fineLevel.m_ngrow,2);
    if (amrex::scale(m_ngrow,2) != fineLevel.m_ngrow) {
        m_ngrow = IntVect::TheZeroVector();
    }

    if (coarsenable)
    {
        int ierr = coarsenFromFine(fineLevel, true);
        m_ok = (ierr == 0);
    }
    else
    {
        Level fine_level_2(is, fineLevel.m_geom);
        fine_level_2.prepareForCoarsening(fineLevel, max_grid_size, amrex::scale(m_ngrow,2));
        int ierr = coarsenFromFine(fine_level_2, false);
        m_ok = (ierr == 0);
    }
}